

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pool.c
# Opt level: O1

void t_pool_destroy(t_pool *p,int kill)

{
  long lVar1;
  long lVar2;
  
  if (kill == 0) {
    pthread_mutex_lock((pthread_mutex_t *)&p->pool_m);
    p->shutdown = 1;
    if (0 < p->tsize) {
      lVar2 = 0x18;
      lVar1 = 0;
      do {
        pthread_cond_signal((pthread_cond_t *)((long)&p->t->p + lVar2));
        lVar1 = lVar1 + 1;
        lVar2 = lVar2 + 0x50;
      } while (lVar1 < p->tsize);
    }
    pthread_mutex_unlock((pthread_mutex_t *)&p->pool_m);
    if (0 < p->tsize) {
      lVar1 = 0x10;
      lVar2 = 0;
      do {
        pthread_join(*(pthread_t *)((long)&p->t->p + lVar1),(void **)0x0);
        lVar2 = lVar2 + 1;
        lVar1 = lVar1 + 0x50;
      } while (lVar2 < p->tsize);
    }
  }
  else if (0 < p->tsize) {
    lVar1 = 0x10;
    lVar2 = 0;
    do {
      pthread_kill(*(pthread_t *)((long)&p->t->p + lVar1),2);
      lVar2 = lVar2 + 1;
      lVar1 = lVar1 + 0x50;
    } while (lVar2 < p->tsize);
  }
  pthread_mutex_destroy((pthread_mutex_t *)&p->pool_m);
  pthread_cond_destroy((pthread_cond_t *)&p->empty_c);
  pthread_cond_destroy((pthread_cond_t *)&p->full_c);
  if (0 < p->tsize) {
    lVar1 = 0x18;
    lVar2 = 0;
    do {
      pthread_cond_destroy((pthread_cond_t *)((long)&p->t->p + lVar1));
      lVar2 = lVar2 + 1;
      lVar1 = lVar1 + 0x50;
    } while (lVar2 < p->tsize);
  }
  if (p->t_stack != (int *)0x0) {
    free(p->t_stack);
  }
  free(p->t);
  free(p);
  return;
}

Assistant:

void t_pool_destroy(t_pool *p, int kill) {
    int i;
    
#ifdef DEBUG
    fprintf(stderr, "Destroying pool %p, kill=%d\n", p, kill);
#endif

    /* Send shutdown message to worker threads */
    if (!kill) {
	pthread_mutex_lock(&p->pool_m);
	p->shutdown = 1;

#ifdef DEBUG
	fprintf(stderr, "Sending shutdown request\n");
#endif

#ifdef IN_ORDER
	for (i = 0; i < p->tsize; i++)
	    pthread_cond_signal(&p->t[i].pending_c);
#else
	pthread_cond_broadcast(&p->pending_c);
#endif
	pthread_mutex_unlock(&p->pool_m);

#ifdef DEBUG
	fprintf(stderr, "Shutdown complete\n");
#endif
	for (i = 0; i < p->tsize; i++)
	    pthread_join(p->t[i].tid, NULL);
    } else {
	for (i = 0; i < p->tsize; i++)
	    pthread_kill(p->t[i].tid, SIGINT);
    }

    pthread_mutex_destroy(&p->pool_m);
    pthread_cond_destroy(&p->empty_c);
    pthread_cond_destroy(&p->full_c);
#ifdef IN_ORDER
    for (i = 0; i < p->tsize; i++)
	pthread_cond_destroy(&p->t[i].pending_c);
#else
    pthread_cond_destroy(&p->pending_c);
#endif

#ifdef DEBUG_TIME
    fprintf(stderr, "Total time=%f\n", p->total_time / 1000000.0);
    fprintf(stderr, "Wait  time=%f\n", p->wait_time  / 1000000.0);
    fprintf(stderr, "%d%% utilisation\n",
	    (int)(100 - ((100.0 * p->wait_time) / p->total_time + 0.5)));
    for (i = 0; i < p->tsize; i++)
	fprintf(stderr, "%d: Wait time=%f\n", i,
		p->t[i].wait_time / 1000000.0);
#endif

    if (p->t_stack)
	free(p->t_stack);

    free(p->t);
    free(p);

#ifdef DEBUG
    fprintf(stderr, "Destroyed pool %p\n", p);
#endif
}